

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlookup.cpp
# Opt level: O1

VertexLookup Vl_createVertexLookup(void)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x48);
  *(undefined4 *)((long)pvVar1 + 8) = 0;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0;
  *(long *)((long)pvVar1 + 0x18) = (long)pvVar1 + 8;
  *(long *)((long)pvVar1 + 0x20) = (long)pvVar1 + 8;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  return pvVar1;
}

Assistant:

VertexLookup Vl_createVertexLookup(void)
{
  VertexLookup ret = new VertexPool< VertexPosition >;
  return ret;
}